

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::LoopFusion::ContainsBarriersOrFunctionCalls(LoopFusion *this,Loop *loop)

{
  Op OVar1;
  BasicBlock *pBVar2;
  Instruction *pIVar3;
  Instruction *inst;
  Instruction **ppIVar4;
  __node_base *p_Var5;
  iterator iVar6;
  
  p_Var5 = &(loop->loop_basic_blocks_)._M_h._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    iVar6 = Function::FindBlock(this->containing_function_,(uint32_t)*(size_type *)(p_Var5 + 1));
    pBVar2 = ((iVar6.iterator_._M_current._M_current)->_M_t).
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    ppIVar4 = (Instruction **)
              ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
    while (pIVar3 = *ppIVar4,
          pIVar3 != (Instruction *)
                    ((long)&(pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction> + 8U))
    {
      OVar1 = pIVar3->opcode_;
      if (((OVar1 - OpTypeNamedBarrier < 3) || (OVar1 - OpControlBarrier < 2)) ||
         (OVar1 == OpFunctionCall)) goto LAB_00236159;
      ppIVar4 = &(pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
    }
  }
LAB_00236159:
  return p_Var5 != (__node_base *)0x0;
}

Assistant:

bool LoopFusion::ContainsBarriersOrFunctionCalls(Loop* loop) {
  for (const auto& block : loop->GetBlocks()) {
    for (const auto& inst : *containing_function_->FindBlock(block)) {
      auto opcode = inst.opcode();
      if (opcode == spv::Op::OpFunctionCall ||
          opcode == spv::Op::OpControlBarrier ||
          opcode == spv::Op::OpMemoryBarrier ||
          opcode == spv::Op::OpTypeNamedBarrier ||
          opcode == spv::Op::OpNamedBarrierInitialize ||
          opcode == spv::Op::OpMemoryNamedBarrier) {
        return true;
      }
    }
  }

  return false;
}